

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * vdbeSorterRowkey(VdbeSorter *pSorter,int *pnKey)

{
  int iVar1;
  PmaReader *pPVar2;
  PmaReader *pReader;
  void *pKey;
  int *pnKey_local;
  VdbeSorter *pSorter_local;
  
  if (pSorter->bUsePMA == '\0') {
    *pnKey = ((pSorter->list).pList)->nVal;
    pReader = (PmaReader *)((pSorter->list).pList + 1);
  }
  else {
    pPVar2 = pSorter->pMerger->aReadr;
    iVar1 = pSorter->pMerger->aTree[1];
    *pnKey = pPVar2[iVar1].nKey;
    pReader = (PmaReader *)pPVar2[iVar1].aKey;
  }
  return pReader;
}

Assistant:

static void *vdbeSorterRowkey(
  const VdbeSorter *pSorter,      /* Sorter object */
  int *pnKey                      /* OUT: Size of current key in bytes */
){
  void *pKey;
  if( pSorter->bUsePMA ){
    PmaReader *pReader;
#if SQLITE_MAX_WORKER_THREADS>0
    if( pSorter->bUseThreads ){
      pReader = pSorter->pReader;
    }else
#endif
    /*if( !pSorter->bUseThreads )*/{
      pReader = &pSorter->pMerger->aReadr[pSorter->pMerger->aTree[1]];
    }
    *pnKey = pReader->nKey;
    pKey = pReader->aKey;
  }else{
    *pnKey = pSorter->list.pList->nVal;
    pKey = SRVAL(pSorter->list.pList);
  }
  return pKey;
}